

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int UTF8ToHtml(uchar *out,int *outlen,uchar *in,int *inlen)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  htmlEntityDesc *phVar4;
  size_t sVar5;
  byte *pbVar6;
  int iVar7;
  uchar *outstart;
  uint uVar8;
  char *__s;
  byte *pbVar9;
  uchar *puVar10;
  ulong uStack_80;
  int local_78;
  int local_68;
  char nbuf [16];
  
  if (inlen == (int *)0x0 || (outlen == (int *)0x0 || out == (uchar *)0x0)) {
    return -1;
  }
  if (in == (uchar *)0x0) {
    *outlen = 0;
    iVar7 = 0;
    iVar3 = 0;
  }
  else {
    pbVar6 = in + *inlen;
    iVar3 = *outlen;
    pbVar9 = in;
    puVar10 = out;
    while( true ) {
      local_68 = (int)in;
      local_78 = (int)out;
      iVar7 = (int)pbVar9;
      if (pbVar6 <= pbVar9) break;
      bVar1 = *pbVar9;
      uVar8 = (uint)bVar1;
      uStack_80 = 0;
      if ((char)bVar1 < '\0') {
        if (bVar1 < 0xc0) {
LAB_001491c8:
          *outlen = (int)puVar10 - local_78;
          iVar3 = -2;
          goto LAB_001491b2;
        }
        uVar8 = (uint)bVar1;
        if (bVar1 < 0xe0) {
          uVar8 = uVar8 & 0x1f;
          uStack_80 = 1;
        }
        else if (bVar1 < 0xf0) {
          uVar8 = uVar8 & 0xf;
          uStack_80 = 2;
        }
        else {
          if (0xf7 < bVar1) goto LAB_001491c8;
          uVar8 = uVar8 & 7;
          uStack_80 = 3;
        }
      }
      pbVar9 = pbVar9 + 1;
      if ((long)pbVar6 - (long)pbVar9 < (long)uStack_80) break;
      while ((iVar2 = (int)uStack_80, uStack_80 = (ulong)(iVar2 - 1), iVar2 != 0 &&
             (pbVar9 < pbVar6))) {
        bVar1 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        if ((bVar1 & 0xffffffc0) != 0x80) break;
        uVar8 = uVar8 << 6 | bVar1 & 0x3f;
      }
      if (uVar8 < 0x80) {
        if (out + iVar3 <= puVar10 + 1) break;
        *puVar10 = (uchar)uVar8;
        puVar10 = puVar10 + 1;
      }
      else {
        phVar4 = htmlEntityValueLookup(uVar8);
        if (phVar4 == (htmlEntityDesc *)0x0) {
          __s = nbuf;
          snprintf(__s,0x10,"#%u",(ulong)uVar8);
        }
        else {
          __s = phVar4->name;
        }
        sVar5 = strlen(__s);
        sVar5 = (size_t)(int)sVar5;
        if (out + iVar3 <= puVar10 + sVar5 + 2) break;
        *puVar10 = '&';
        memcpy(puVar10 + 1,__s,sVar5);
        puVar10[sVar5 + 1] = ';';
        puVar10 = puVar10 + sVar5 + 2;
      }
    }
    *outlen = (int)puVar10 - local_78;
    iVar3 = 0;
LAB_001491b2:
    iVar7 = iVar7 - local_68;
  }
  *inlen = iVar7;
  return iVar3;
}

Assistant:

int
UTF8ToHtml(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    const unsigned char* processed = in;
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
        /*
	 * initialization nothing to do
	 */
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + (*inlen);
    outend = out + (*outlen);
    while (in < inend) {
	d = *in++;
	if      (d < 0x80)  { c= d; trailing= 0; }
	else if (d < 0xC0) {
	    /* trailing byte in leading position */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
        } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
        else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
        else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
	else {
	    /* no chance for this in Ascii */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}

	if (inend - in < trailing) {
	    break;
	}

	for ( ; trailing; trailing--) {
	    if ((in >= inend) || (((d= *in++) & 0xC0) != 0x80))
		break;
	    c <<= 6;
	    c |= d & 0x3F;
	}

	/* assertion: c is a single UTF-4 value */
	if (c < 0x80) {
	    if (out + 1 >= outend)
		break;
	    *out++ = c;
	} else {
	    int len;
	    const htmlEntityDesc * ent;
	    const char *cp;
	    char nbuf[16];

	    /*
	     * Try to lookup a predefined HTML entity for it
	     */

	    ent = htmlEntityValueLookup(c);
	    if (ent == NULL) {
	      snprintf(nbuf, sizeof(nbuf), "#%u", c);
	      cp = nbuf;
	    }
	    else
	      cp = ent->name;
	    len = strlen(cp);
	    if (out + 2 + len >= outend)
		break;
	    *out++ = '&';
	    memcpy(out, cp, len);
	    out += len;
	    *out++ = ';';
	}
	processed = in;
    }
    *outlen = out - outstart;
    *inlen = processed - instart;
    return(0);
}